

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_26(QPDF *pdf,char *arg2)

{
  QPDFPageObjectHelper QVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle QVar3;
  QPDFWriter w;
  QPDFObjectHandle O3;
  QPDF oldpdf;
  QPDFObjectHandle qtest;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff30;
  element_type *in_stack_ffffffffffffff38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff58;
  undefined8 local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  element_type local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  QPDFPageObjectHelper local_50;
  
  if (arg2 != (char *)0x0) {
    QPDF::QPDF((QPDF *)&stack0xffffffffffffff58);
    QPDF::processFile((char *)&stack0xffffffffffffff58,arg2);
    QPDF::getTrailer();
    peVar4 = (element_type *)&stack0xffffffffffffff38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff28,"/QTest","");
    QPDFObjectHandle::getKey((string *)&local_a0);
    if (peVar4 != (element_type *)&stack0xffffffffffffff38) {
      operator_delete(peVar4,(ulong)(in_stack_ffffffffffffff38 + 1));
    }
    if (in_stack_ffffffffffffff50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffffff50);
    }
    peVar4 = (element_type *)&stack0xffffffffffffff38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff28,"/O3","");
    QPDFObjectHandle::getKey((string *)&stack0xffffffffffffff48);
    if (peVar4 != (element_type *)&stack0xffffffffffffff38) {
      operator_delete(peVar4,(ulong)(in_stack_ffffffffffffff38 + 1));
    }
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)&stack0xffffffffffffff28,pdf);
    if (in_stack_ffffffffffffff50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        in_stack_ffffffffffffff50->_M_use_count = in_stack_ffffffffffffff50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        in_stack_ffffffffffffff50->_M_use_count = in_stack_ffffffffffffff50->_M_use_count + 1;
      }
    }
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_80;
    local_78 = in_stack_ffffffffffffff50;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_50,QVar2);
    QVar1._8_8_ = in_stack_ffffffffffffff30._M_pi;
    QVar1._0_8_ = peVar4;
    QVar1._16_8_ = in_stack_ffffffffffffff38;
    QVar1._24_8_ = in_stack_ffffffffffffff40._M_pi;
    QVar1._32_8_ = in_stack_ffffffffffffff48;
    QVar1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)in_stack_ffffffffffffff50;
    QVar1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_stack_ffffffffffffff58._M_pi;
    QPDFPageDocumentHelper::addPage(QVar1,SUB81(&stack0xffffffffffffff28,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_50);
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)&stack0xffffffffffffff28);
    QPDF::getTrailer();
    peVar4 = (element_type *)&stack0xffffffffffffff38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff28,"/QTest","");
    local_90 = local_a0;
    local_88 = local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_70;
    QPDF::copyForeignObject(QVar3);
    QPDFObjectHandle::replaceKey(local_60,(QPDFObjectHandle *)&stack0xffffffffffffff28);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
    if (peVar4 != (element_type *)&stack0xffffffffffffff38) {
      operator_delete(peVar4,(ulong)(in_stack_ffffffffffffff38 + 1));
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (in_stack_ffffffffffffff50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffffff50);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    QPDF::~QPDF((QPDF *)&stack0xffffffffffffff58);
    QPDFWriter::QPDFWriter((QPDFWriter *)&stack0xffffffffffffff28,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&stack0xffffffffffffff28,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&stack0xffffffffffffff28);
    QPDFWriter::write();
    if (in_stack_ffffffffffffff30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffffff30._M_pi)
      ;
    }
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x3d8,"void test_26(QPDF &, const char *)");
}

Assistant:

static void
test_26(QPDF& pdf, char const* arg2)
{
    // Copy the O3 page using addPage.  Copy qtest without
    // crossing page boundaries.  In addition to previous results,
    // should get page O3 but no other pages including the page
    // that O3 points to.  Also, inherited object will have been
    // pushed down and will be preserved.

    {
        // Make sure original PDF is out of scope when we write.
        assert(arg2 != nullptr);
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        QPDFObjectHandle O3 = qtest.getKey("/O3");
        QPDFPageDocumentHelper(pdf).addPage(O3, false);
        pdf.getTrailer().replaceKey("/QTest", pdf.copyForeignObject(qtest));
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}